

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

void update_fcr31(CPUMIPSState_conflict10 *env,uintptr_t pc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = ieee_ex_to_mips_mips64el((uint)(env->active_fpu).fp_status.float_exception_flags);
  uVar1 = (env->active_fpu).fcr31;
  uVar3 = (uVar2 & 0x3f) << 0xc | uVar1 & 0xfffc0fff;
  (env->active_fpu).fcr31 = uVar3;
  if (uVar2 != 0) {
    (env->active_fpu).fp_status.float_exception_flags = '\0';
    if ((uVar1 >> 7 & uVar2 & 0x1f) != 0) {
      do_raise_exception(env,0x17,pc);
    }
    (env->active_fpu).fcr31 = uVar3 | (uVar2 & 0x1f) << 2;
  }
  return;
}

Assistant:

static inline void update_fcr31(CPUMIPSState *env, uintptr_t pc)
{
    int tmp = ieee_ex_to_mips(get_float_exception_flags(
                                  &env->active_fpu.fp_status));

    SET_FP_CAUSE(env->active_fpu.fcr31, tmp);

    if (tmp) {
        set_float_exception_flags(0, &env->active_fpu.fp_status);

        if (GET_FP_ENABLE(env->active_fpu.fcr31) & tmp) {
            do_raise_exception(env, EXCP_FPE, pc);
        } else {
            UPDATE_FP_FLAGS(env->active_fpu.fcr31, tmp);
        }
    }
}